

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::tuple::tuple(tuple *this,object *o)

{
  PyObject *pPVar1;
  error_already_set *this_00;
  handle local_20;
  object *local_18;
  object *o_local;
  tuple *this_local;
  
  local_18 = o;
  o_local = &this->super_object;
  pPVar1 = handle::ptr(&o->super_handle);
  pPVar1 = (PyObject *)PySequence_Tuple(pPVar1);
  handle::handle(&local_20,pPVar1);
  object::object(&this->super_object,local_20.m_ptr);
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return;
}

Assistant:

explicit tuple(size_t size = 0) : object(PyTuple_New((ssize_t) size), stolen_t{}) {
        if (!m_ptr) pybind11_fail("Could not allocate tuple object!");
    }